

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

int findlabel(LexState *ls,int g)

{
  int iVar1;
  int iVar2;
  Dyndata *pDVar3;
  Labeldesc *pLVar4;
  long lVar5;
  Labeldesc *label;
  
  pDVar3 = ls->dyd;
  iVar1 = ls->fs->bl->firstlabel;
  iVar2 = (pDVar3->label).n;
  if (iVar1 < iVar2) {
    pLVar4 = (pDVar3->gt).arr + g;
    label = (pDVar3->label).arr + iVar1;
    lVar5 = (long)iVar2 - (long)iVar1;
    do {
      if (label->name == pLVar4->name) {
        if (label->nactvar < pLVar4->nactvar) {
          luaK_patchclose(ls->fs,pLVar4->pc,(uint)label->nactvar);
        }
        closegoto(ls,g,label);
        return 1;
      }
      label = label + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return 0;
}

Assistant:

static int findlabel (LexState *ls, int g) {
  int i;
  BlockCnt *bl = ls->fs->bl;
  Dyndata *dyd = ls->dyd;
  Labeldesc *gt = &dyd->gt.arr[g];
  /* check labels in current block for a match */
  for (i = bl->firstlabel; i < dyd->label.n; i++) {
    Labeldesc *lb = &dyd->label.arr[i];
    if (eqstr(lb->name, gt->name)) {  /* correct label? */
      if (gt->nactvar > lb->nactvar &&
          (bl->upval || dyd->label.n > bl->firstlabel))
        luaK_patchclose(ls->fs, gt->pc, lb->nactvar);
      closegoto(ls, g, lb);  /* close it */
      return 1;
    }
  }
  return 0;  /* label not found; cannot close goto */
}